

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm1d.c
# Opt level: O0

void av1_fdct16(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int32_t iVar1;
  int8_t *in_RCX;
  char in_DL;
  int32_t *in_RSI;
  int32_t *in_RDI;
  int32_t step [16];
  int32_t *bf1;
  int32_t *bf0;
  int32_t stage;
  int32_t *cospi;
  int32_t size;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int32_t local_60;
  int32_t local_5c;
  int32_t local_58;
  int32_t local_54;
  int32_t local_50;
  int32_t local_4c;
  int32_t *local_48;
  int *local_40;
  int local_34;
  int32_t *local_30;
  undefined4 local_24;
  int8_t *local_20;
  char local_11;
  int32_t *local_10;
  int32_t *local_8;
  
  local_24 = 0x10;
  local_34 = 0;
  local_20 = in_RCX;
  local_11 = in_DL;
  local_10 = in_RSI;
  local_8 = in_RDI;
  av1_range_check_buf(0,in_RDI,in_RDI,0x10,*in_RCX);
  local_34 = local_34 + 1;
  local_48 = local_10;
  *local_10 = *local_8 + local_8[0xf];
  local_10[1] = local_8[1] + local_8[0xe];
  local_10[2] = local_8[2] + local_8[0xd];
  local_10[3] = local_8[3] + local_8[0xc];
  local_10[4] = local_8[4] + local_8[0xb];
  local_10[5] = local_8[5] + local_8[10];
  local_10[6] = local_8[6] + local_8[9];
  local_10[7] = local_8[7] + local_8[8];
  local_10[8] = local_8[7] - local_8[8];
  local_10[9] = local_8[6] - local_8[9];
  local_10[10] = local_8[5] - local_8[10];
  local_10[0xb] = local_8[4] - local_8[0xb];
  local_10[0xc] = local_8[3] - local_8[0xc];
  local_10[0xd] = local_8[2] - local_8[0xd];
  local_10[0xe] = local_8[1] - local_8[0xe];
  local_10[0xf] = *local_8 - local_8[0xf];
  av1_range_check_buf(local_34,local_8,local_10,0x10,local_20[local_34]);
  local_34 = local_34 + 1;
  local_30 = cospi_arr((int)local_11);
  local_40 = local_10;
  local_88 = *local_10 + local_10[7];
  local_84 = local_10[1] + local_10[6];
  local_80 = local_10[2] + local_10[5];
  local_7c = local_10[3] + local_10[4];
  local_78 = local_10[3] - local_10[4];
  local_74 = local_10[2] - local_10[5];
  local_70 = local_10[1] - local_10[6];
  local_6c = *local_10 - local_10[7];
  local_68 = local_10[8];
  local_64 = local_10[9];
  local_48 = &local_88;
  iVar1 = half_btf(-local_30[0x20],local_10[10],local_30[0x20],local_10[0xd],(int)local_11);
  local_48[10] = iVar1;
  iVar1 = half_btf(-local_30[0x20],local_40[0xb],local_30[0x20],local_40[0xc],(int)local_11);
  local_48[0xb] = iVar1;
  iVar1 = half_btf(local_30[0x20],local_40[0xc],local_30[0x20],local_40[0xb],(int)local_11);
  local_48[0xc] = iVar1;
  iVar1 = half_btf(local_30[0x20],local_40[0xd],local_30[0x20],local_40[10],(int)local_11);
  local_48[0xd] = iVar1;
  local_48[0xe] = local_40[0xe];
  local_48[0xf] = local_40[0xf];
  av1_range_check_buf(local_34,local_8,local_48,0x10,local_20[local_34]);
  local_34 = local_34 + 1;
  local_30 = cospi_arr((int)local_11);
  local_48 = local_10;
  *local_10 = local_88 + local_7c;
  local_10[1] = local_84 + local_80;
  local_10[2] = local_84 - local_80;
  local_10[3] = local_88 - local_7c;
  local_10[4] = local_78;
  local_40 = &local_88;
  iVar1 = half_btf(-local_30[0x20],local_74,local_30[0x20],local_70,(int)local_11);
  local_48[5] = iVar1;
  iVar1 = half_btf(local_30[0x20],*(int32_t *)((long)local_40 + 0x18),local_30[0x20],
                   *(int32_t *)((long)local_40 + 0x14),(int)local_11);
  local_48[6] = iVar1;
  local_48[7] = *(int32_t *)((long)local_40 + 0x1c);
  local_48[8] = *(int *)((long)local_40 + 0x20) + *(int *)((long)local_40 + 0x2c);
  local_48[9] = *(int *)((long)local_40 + 0x24) + *(int *)((long)local_40 + 0x28);
  local_48[10] = *(int *)((long)local_40 + 0x24) - *(int *)((long)local_40 + 0x28);
  local_48[0xb] = *(int *)((long)local_40 + 0x20) - *(int *)((long)local_40 + 0x2c);
  local_48[0xc] = *(int *)((long)local_40 + 0x3c) - *(int *)((long)local_40 + 0x30);
  local_48[0xd] = *(int *)((long)local_40 + 0x38) - *(int *)((long)local_40 + 0x34);
  local_48[0xe] = *(int *)((long)local_40 + 0x38) + *(int *)((long)local_40 + 0x34);
  local_48[0xf] = *(int *)((long)local_40 + 0x3c) + *(int *)((long)local_40 + 0x30);
  av1_range_check_buf(local_34,local_8,local_48,0x10,local_20[local_34]);
  local_34 = local_34 + 1;
  local_30 = cospi_arr((int)local_11);
  local_40 = local_10;
  local_48 = &local_88;
  iVar1 = half_btf(local_30[0x20],*local_10,local_30[0x20],local_10[1],(int)local_11);
  *local_48 = iVar1;
  iVar1 = half_btf(-local_30[0x20],local_40[1],local_30[0x20],*local_40,(int)local_11);
  local_48[1] = iVar1;
  iVar1 = half_btf(local_30[0x30],local_40[2],local_30[0x10],local_40[3],(int)local_11);
  local_48[2] = iVar1;
  iVar1 = half_btf(local_30[0x30],local_40[3],-local_30[0x10],local_40[2],(int)local_11);
  local_48[3] = iVar1;
  local_48[4] = local_40[4] + local_40[5];
  local_48[5] = local_40[4] - local_40[5];
  local_48[6] = local_40[7] - local_40[6];
  local_48[7] = local_40[7] + local_40[6];
  local_48[8] = local_40[8];
  iVar1 = half_btf(-local_30[0x10],local_40[9],local_30[0x30],local_40[0xe],(int)local_11);
  local_48[9] = iVar1;
  iVar1 = half_btf(-local_30[0x30],local_40[10],-local_30[0x10],local_40[0xd],(int)local_11);
  local_48[10] = iVar1;
  local_48[0xb] = local_40[0xb];
  local_48[0xc] = local_40[0xc];
  iVar1 = half_btf(local_30[0x30],local_40[0xd],-local_30[0x10],local_40[10],(int)local_11);
  local_48[0xd] = iVar1;
  iVar1 = half_btf(local_30[0x10],local_40[0xe],local_30[0x30],local_40[9],(int)local_11);
  local_48[0xe] = iVar1;
  local_48[0xf] = local_40[0xf];
  av1_range_check_buf(local_34,local_8,local_48,0x10,local_20[local_34]);
  local_34 = local_34 + 1;
  local_30 = cospi_arr((int)local_11);
  local_48 = local_10;
  *local_10 = local_88;
  local_10[1] = local_84;
  local_10[2] = local_80;
  local_10[3] = local_7c;
  local_40 = &local_88;
  iVar1 = half_btf(local_30[0x38],local_78,local_30[8],local_6c,(int)local_11);
  local_48[4] = iVar1;
  iVar1 = half_btf(local_30[0x18],*(int32_t *)((long)local_40 + 0x14),local_30[0x28],
                   *(int32_t *)((long)local_40 + 0x18),(int)local_11);
  local_48[5] = iVar1;
  iVar1 = half_btf(local_30[0x18],*(int32_t *)((long)local_40 + 0x18),-local_30[0x28],
                   *(int32_t *)((long)local_40 + 0x14),(int)local_11);
  local_48[6] = iVar1;
  iVar1 = half_btf(local_30[0x38],*(int32_t *)((long)local_40 + 0x1c),-local_30[8],
                   *(int32_t *)((long)local_40 + 0x10),(int)local_11);
  local_48[7] = iVar1;
  local_48[8] = *(int *)((long)local_40 + 0x20) + *(int *)((long)local_40 + 0x24);
  local_48[9] = *(int *)((long)local_40 + 0x20) - *(int *)((long)local_40 + 0x24);
  local_48[10] = *(int *)((long)local_40 + 0x2c) - *(int *)((long)local_40 + 0x28);
  local_48[0xb] = *(int *)((long)local_40 + 0x2c) + *(int *)((long)local_40 + 0x28);
  local_48[0xc] = *(int *)((long)local_40 + 0x30) + *(int *)((long)local_40 + 0x34);
  local_48[0xd] = *(int *)((long)local_40 + 0x30) - *(int *)((long)local_40 + 0x34);
  local_48[0xe] = *(int *)((long)local_40 + 0x3c) - *(int *)((long)local_40 + 0x38);
  local_48[0xf] = *(int *)((long)local_40 + 0x3c) + *(int *)((long)local_40 + 0x38);
  av1_range_check_buf(local_34,local_8,local_48,0x10,local_20[local_34]);
  local_34 = local_34 + 1;
  local_30 = cospi_arr((int)local_11);
  local_40 = local_10;
  local_88 = *local_10;
  local_84 = local_10[1];
  local_80 = local_10[2];
  local_7c = local_10[3];
  local_78 = local_10[4];
  local_74 = local_10[5];
  local_70 = local_10[6];
  local_6c = local_10[7];
  local_48 = &local_88;
  iVar1 = half_btf(local_30[0x3c],local_10[8],local_30[4],local_10[0xf],(int)local_11);
  local_48[8] = iVar1;
  iVar1 = half_btf(local_30[0x1c],local_40[9],local_30[0x24],local_40[0xe],(int)local_11);
  local_48[9] = iVar1;
  iVar1 = half_btf(local_30[0x2c],local_40[10],local_30[0x14],local_40[0xd],(int)local_11);
  local_48[10] = iVar1;
  iVar1 = half_btf(local_30[0xc],local_40[0xb],local_30[0x34],local_40[0xc],(int)local_11);
  local_48[0xb] = iVar1;
  iVar1 = half_btf(local_30[0xc],local_40[0xc],-local_30[0x34],local_40[0xb],(int)local_11);
  local_48[0xc] = iVar1;
  iVar1 = half_btf(local_30[0x2c],local_40[0xd],-local_30[0x14],local_40[10],(int)local_11);
  local_48[0xd] = iVar1;
  iVar1 = half_btf(local_30[0x1c],local_40[0xe],-local_30[0x24],local_40[9],(int)local_11);
  local_48[0xe] = iVar1;
  iVar1 = half_btf(local_30[0x3c],local_40[0xf],-local_30[4],local_40[8],(int)local_11);
  local_48[0xf] = iVar1;
  av1_range_check_buf(local_34,local_8,local_48,0x10,local_20[local_34]);
  local_34 = local_34 + 1;
  local_48 = local_10;
  *local_10 = local_88;
  local_10[1] = local_68;
  local_10[2] = local_78;
  local_10[3] = local_58;
  local_10[4] = local_80;
  local_10[5] = local_60;
  local_10[6] = local_70;
  local_10[7] = local_50;
  local_10[8] = local_84;
  local_10[9] = local_64;
  local_10[10] = local_74;
  local_10[0xb] = local_54;
  local_10[0xc] = local_7c;
  local_10[0xd] = local_5c;
  local_10[0xe] = local_6c;
  local_10[0xf] = local_4c;
  local_40 = &local_88;
  av1_range_check_buf(local_34,local_8,local_10,0x10,local_20[local_34]);
  return;
}

Assistant:

void av1_fdct16(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  const int32_t size = 16;
  const int32_t *cospi;

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[16];

  // stage 0;
  av1_range_check_buf(stage, input, input, size, stage_range[stage]);

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0] + input[15];
  bf1[1] = input[1] + input[14];
  bf1[2] = input[2] + input[13];
  bf1[3] = input[3] + input[12];
  bf1[4] = input[4] + input[11];
  bf1[5] = input[5] + input[10];
  bf1[6] = input[6] + input[9];
  bf1[7] = input[7] + input[8];
  bf1[8] = -input[8] + input[7];
  bf1[9] = -input[9] + input[6];
  bf1[10] = -input[10] + input[5];
  bf1[11] = -input[11] + input[4];
  bf1[12] = -input[12] + input[3];
  bf1[13] = -input[13] + input[2];
  bf1[14] = -input[14] + input[1];
  bf1[15] = -input[15] + input[0];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0] + bf0[7];
  bf1[1] = bf0[1] + bf0[6];
  bf1[2] = bf0[2] + bf0[5];
  bf1[3] = bf0[3] + bf0[4];
  bf1[4] = -bf0[4] + bf0[3];
  bf1[5] = -bf0[5] + bf0[2];
  bf1[6] = -bf0[6] + bf0[1];
  bf1[7] = -bf0[7] + bf0[0];
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = half_btf(-cospi[32], bf0[10], cospi[32], bf0[13], cos_bit);
  bf1[11] = half_btf(-cospi[32], bf0[11], cospi[32], bf0[12], cos_bit);
  bf1[12] = half_btf(cospi[32], bf0[12], cospi[32], bf0[11], cos_bit);
  bf1[13] = half_btf(cospi[32], bf0[13], cospi[32], bf0[10], cos_bit);
  bf1[14] = bf0[14];
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0] + bf0[3];
  bf1[1] = bf0[1] + bf0[2];
  bf1[2] = -bf0[2] + bf0[1];
  bf1[3] = -bf0[3] + bf0[0];
  bf1[4] = bf0[4];
  bf1[5] = half_btf(-cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[32], bf0[6], cospi[32], bf0[5], cos_bit);
  bf1[7] = bf0[7];
  bf1[8] = bf0[8] + bf0[11];
  bf1[9] = bf0[9] + bf0[10];
  bf1[10] = -bf0[10] + bf0[9];
  bf1[11] = -bf0[11] + bf0[8];
  bf1[12] = -bf0[12] + bf0[15];
  bf1[13] = -bf0[13] + bf0[14];
  bf1[14] = bf0[14] + bf0[13];
  bf1[15] = bf0[15] + bf0[12];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(-cospi[32], bf0[1], cospi[32], bf0[0], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[48], bf0[3], -cospi[16], bf0[2], cos_bit);
  bf1[4] = bf0[4] + bf0[5];
  bf1[5] = -bf0[5] + bf0[4];
  bf1[6] = -bf0[6] + bf0[7];
  bf1[7] = bf0[7] + bf0[6];
  bf1[8] = bf0[8];
  bf1[9] = half_btf(-cospi[16], bf0[9], cospi[48], bf0[14], cos_bit);
  bf1[10] = half_btf(-cospi[48], bf0[10], -cospi[16], bf0[13], cos_bit);
  bf1[11] = bf0[11];
  bf1[12] = bf0[12];
  bf1[13] = half_btf(cospi[48], bf0[13], -cospi[16], bf0[10], cos_bit);
  bf1[14] = half_btf(cospi[16], bf0[14], cospi[48], bf0[9], cos_bit);
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[56], bf0[4], cospi[8], bf0[7], cos_bit);
  bf1[5] = half_btf(cospi[24], bf0[5], cospi[40], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[24], bf0[6], -cospi[40], bf0[5], cos_bit);
  bf1[7] = half_btf(cospi[56], bf0[7], -cospi[8], bf0[4], cos_bit);
  bf1[8] = bf0[8] + bf0[9];
  bf1[9] = -bf0[9] + bf0[8];
  bf1[10] = -bf0[10] + bf0[11];
  bf1[11] = bf0[11] + bf0[10];
  bf1[12] = bf0[12] + bf0[13];
  bf1[13] = -bf0[13] + bf0[12];
  bf1[14] = -bf0[14] + bf0[15];
  bf1[15] = bf0[15] + bf0[14];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = bf0[6];
  bf1[7] = bf0[7];
  bf1[8] = half_btf(cospi[60], bf0[8], cospi[4], bf0[15], cos_bit);
  bf1[9] = half_btf(cospi[28], bf0[9], cospi[36], bf0[14], cos_bit);
  bf1[10] = half_btf(cospi[44], bf0[10], cospi[20], bf0[13], cos_bit);
  bf1[11] = half_btf(cospi[12], bf0[11], cospi[52], bf0[12], cos_bit);
  bf1[12] = half_btf(cospi[12], bf0[12], -cospi[52], bf0[11], cos_bit);
  bf1[13] = half_btf(cospi[44], bf0[13], -cospi[20], bf0[10], cos_bit);
  bf1[14] = half_btf(cospi[28], bf0[14], -cospi[36], bf0[9], cos_bit);
  bf1[15] = half_btf(cospi[60], bf0[15], -cospi[4], bf0[8], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = bf0[8];
  bf1[2] = bf0[4];
  bf1[3] = bf0[12];
  bf1[4] = bf0[2];
  bf1[5] = bf0[10];
  bf1[6] = bf0[6];
  bf1[7] = bf0[14];
  bf1[8] = bf0[1];
  bf1[9] = bf0[9];
  bf1[10] = bf0[5];
  bf1[11] = bf0[13];
  bf1[12] = bf0[3];
  bf1[13] = bf0[11];
  bf1[14] = bf0[7];
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);
}